

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_cmdline.c
# Opt level: O0

int cmdline_add_arg(archive_cmdline *data,char *arg)

{
  char **ppcVar1;
  char *pcVar2;
  int iVar3;
  char **newargv;
  char *arg_local;
  archive_cmdline *data_local;
  
  if (data->path == (char *)0x0) {
    data_local._4_4_ = -0x19;
  }
  else {
    ppcVar1 = (char **)realloc(data->argv,(long)(data->argc + 2) << 3);
    if (ppcVar1 == (char **)0x0) {
      data_local._4_4_ = -0x1e;
    }
    else {
      data->argv = ppcVar1;
      pcVar2 = strdup(arg);
      data->argv[data->argc] = pcVar2;
      if (data->argv[data->argc] == (char *)0x0) {
        data_local._4_4_ = -0x1e;
      }
      else {
        iVar3 = data->argc + 1;
        data->argc = iVar3;
        data->argv[iVar3] = (char *)0x0;
        data_local._4_4_ = 0;
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

static int
cmdline_add_arg(struct archive_cmdline *data, const char *arg)
{
	char **newargv;

	if (data->path == NULL)
		return (ARCHIVE_FAILED);

	newargv = realloc(data->argv, (data->argc + 2) * sizeof(char *));
	if (newargv == NULL)
		return (ARCHIVE_FATAL);
	data->argv = newargv;
	data->argv[data->argc] = strdup(arg);
	if (data->argv[data->argc] == NULL)
		return (ARCHIVE_FATAL);
	/* Set the terminator of argv. */
	data->argv[++data->argc] = NULL;
	return (ARCHIVE_OK);
}